

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::ConfigCellIdentifierSyntax::getChildPtr
          (ConfigCellIdentifierSyntax *this,size_t index)

{
  long in_RSI;
  PtrTokenOrSyntax *in_RDI;
  Token *in_stack_ffffffffffffffc8;
  undefined8 local_10;
  
  if (in_RSI == 0) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RSI == 1) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RSI == 2) {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax ConfigCellIdentifierSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &library;
        case 1: return &dot;
        case 2: return &cell;
        default: return nullptr;
    }
}